

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

size_t readfromfile(Form *form,char *buffer,size_t size)

{
  FILE *pFVar1;
  size_t sStack_30;
  _Bool callback;
  size_t nread;
  size_t size_local;
  char *buffer_local;
  Form *form_local;
  
  if (form->data->type == FORM_CALLBACK) {
    if (form->fread_func == (curl_read_callback)0x0) {
      return 0;
    }
    sStack_30 = (*form->fread_func)(buffer,1,size,form->data->line);
  }
  else {
    if (form->fp == (FILE *)0x0) {
      pFVar1 = fopen64(form->data->line,"rb");
      form->fp = (FILE *)pFVar1;
      if (form->fp == (FILE *)0x0) {
        return 0xffffffffffffffff;
      }
    }
    sStack_30 = fread(buffer,1,size,(FILE *)form->fp);
  }
  if (sStack_30 == 0) {
    if (form->fp != (FILE *)0x0) {
      fclose((FILE *)form->fp);
      form->fp = (FILE *)0x0;
    }
    form->data = form->data->next;
  }
  return sStack_30;
}

Assistant:

static size_t readfromfile(struct Form *form, char *buffer,
                           size_t size)
{
  size_t nread;
  bool callback = (form->data->type == FORM_CALLBACK)?TRUE:FALSE;

  if(callback) {
    if(form->fread_func == ZERO_NULL)
      return 0;
    else
      nread = form->fread_func(buffer, 1, size, form->data->line);
  }
  else {
    if(!form->fp) {
      /* this file hasn't yet been opened */
      form->fp = fopen_read(form->data->line, "rb"); /* b is for binary */
      if(!form->fp)
        return (size_t)-1; /* failure */
    }
    nread = fread(buffer, 1, size, form->fp);
  }
  if(!nread) {
    /* this is the last chunk from the file, move on */
    if(form->fp) {
      fclose(form->fp);
      form->fp = NULL;
    }
    form->data = form->data->next;
  }

  return nread;
}